

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_product_definition_set_root_type(parser_info *info)

{
  int iVar1;
  
  iVar1 = coda_product_definition_set_root_type
                    ((coda_product_definition *)info->node->parent->data,
                     (coda_type *)info->node->data);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int cd_product_definition_set_root_type(parser_info *info)
{
    if (coda_product_definition_set_root_type((coda_product_definition *)info->node->parent->data,
                                              (coda_type *)info->node->data) != 0)
    {
        return -1;
    }
    return 0;
}